

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O0

int SetMotorOriginIM483I(IM483I *pIM483I)

{
  int writebuflen;
  int iVar1;
  size_t sVar2;
  uint8 local_428 [4];
  int recvbuflen;
  char recvbuf [512];
  uint8 local_218 [4];
  int sendbuflen;
  char sendbuf [512];
  IM483I *pIM483I_local;
  
  sendbuf._504_8_ = pIM483I;
  memset(local_218,0,0x200);
  sprintf((char *)local_218,"O\r");
  sVar2 = strlen((char *)local_218);
  writebuflen = (int)sVar2;
  iVar1 = WriteDataIM483I((IM483I *)sendbuf._504_8_,local_218,writebuflen,
                          *(int *)(sendbuf._504_8_ + 0x534));
  if (iVar1 != 0) {
    printf("Error writing data to a IM483I. \n");
    return 1;
  }
  if ((*(int *)(sendbuf._504_8_ + 0x530) != 0) && (*(long *)(sendbuf._504_8_ + 0x318) != 0)) {
    fwrite(local_218,(long)writebuflen,1,*(FILE **)(sendbuf._504_8_ + 0x318));
    fflush(*(FILE **)(sendbuf._504_8_ + 0x318));
  }
  mSleep(100);
  if (*(int *)(sendbuf._504_8_ + 0x538) != 0) {
    memset(local_428,0,0x200);
    iVar1 = ReadAllRS232Port((RS232PORT *)sendbuf._504_8_,local_428,writebuflen + 1);
    if (iVar1 != 0) {
      printf("Error reading data from a IM483I. \n");
      return 1;
    }
    if ((*(int *)(sendbuf._504_8_ + 0x530) != 0) && (*(long *)(sendbuf._504_8_ + 0x318) != 0)) {
      fwrite(local_428,(long)(writebuflen + 1),1,*(FILE **)(sendbuf._504_8_ + 0x318));
      fflush(*(FILE **)(sendbuf._504_8_ + 0x318));
    }
    iVar1 = strncmp((char *)local_428,(char *)local_218,(long)writebuflen);
    if ((iVar1 != 0) || (local_428[writebuflen] != '\n')) {
      printf("Error reading data from a IM483I : Invalid data. \n");
      return 4;
    }
  }
  return 0;
}

Assistant:

inline int SetMotorOriginIM483I(IM483I* pIM483I)
{
	char sendbuf[MAX_NB_BYTES_IM483I];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_IM483I];
	int recvbuflen = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "O\r");
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataIM483I(pIM483I, (unsigned char*)sendbuf, sendbuflen, pIM483I->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a IM483I. \n");
		return EXIT_FAILURE;
	}
	if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pIM483I->pfSaveFile);
		fflush(pIM483I->pfSaveFile);
	}

	// Seem to take time...
	mSleep(100);

	if (pIM483I->bCheckState)
	{
		// Should echo and add \n...

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = sendbuflen+1; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadAllRS232Port(&pIM483I->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Error reading data from a IM483I. \n");
			return EXIT_FAILURE;
		}
		if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pIM483I->pfSaveFile);
			fflush(pIM483I->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
		if ((strncmp(recvbuf, sendbuf, sendbuflen) != 0)||(recvbuf[recvbuflen-1] != '\n'))
		{
			printf("Error reading data from a IM483I : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
	}

	return EXIT_SUCCESS;
}